

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * duckdb_apache::thrift::to_string<duckdb_parquet::PageEncodingStats>
                   (string *__return_storage_ptr__,
                   vector<duckdb_parquet::PageEncodingStats,_true> *t)

{
  ostream *poVar1;
  __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
  *in_RCX;
  ostringstream o;
  __normal_iterator<const_duckdb_parquet::PageEncodingStats_*,_std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>_>
  local_1c0;
  pointer local_1b8;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  local_1b8 = (t->
              super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
              ).
              super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c0._M_current =
       (t->
       super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
       ).
       super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::PageEncodingStats_const*,std::vector<duckdb_parquet::PageEncodingStats,std::allocator<duckdb_parquet::PageEncodingStats>>>>
            (&local_1b0,(thrift *)&local_1b8,&local_1c0,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const duckdb::vector<T>& t) {
  std::ostringstream o;
  o << "[" << to_string(t.begin(), t.end()) << "]";
  return o.str();
}